

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::fpToString<double>(string *__return_storage_ptr__,double value,int precision)

{
  char cVar1;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar2;
  size_t sVar3;
  size_type sVar4;
  long lVar5;
  size_type sVar6;
  ReusableStringStream rss;
  ReusableStringStream local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (NAN(value)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"nan","");
  }
  else {
    local_50.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001c36a8
    ;
    pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    sVar3 = StringStreams::add(&pSVar2->super_StringStreams);
    local_50.m_index = sVar3;
    pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    local_50.m_oss =
         *(ostream **)
          &(pSVar2->super_StringStreams).m_streams.
           super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar3]._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    lVar5 = *(long *)local_50.m_oss;
    *(long *)((long)local_50.m_oss + *(long *)(lVar5 + -0x18) + 8) = (long)precision;
    lVar5 = *(long *)(lVar5 + -0x18);
    *(uint *)((long)local_50.m_oss + lVar5 + 0x18) =
         *(uint *)((long)local_50.m_oss + lVar5 + 0x18) & 0xfffffefb | 4;
    std::ostream::_M_insert<double>(value);
    std::__cxx11::stringbuf::str();
    sVar4 = __return_storage_ptr__->_M_string_length;
    if (sVar4 != 0) {
      lVar5 = 0;
      do {
        cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[sVar4 - 1];
        if (cVar1 != '0') {
          if (lVar5 != 0) {
            sVar6 = sVar4 - 1;
            if (cVar1 == '.') {
              sVar6 = sVar4;
            }
            clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(&local_38,__return_storage_ptr__,0,sVar6 + 1);
            fpToString<double>();
          }
          break;
        }
        sVar4 = sVar4 - 1;
        lVar5 = lVar5 + 1;
      } while (sVar4 != 0);
    }
    ReusableStringStream::~ReusableStringStream(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fpToString(T value, int precision) {
    if (Catch::isnan(value)) {
      return "nan";
    }

    ReusableStringStream rss;
    rss << std::setprecision(precision) << std::fixed << value;
    std::string d = rss.str();
    std::size_t i = d.find_last_not_of('0');
    if (i != std::string::npos && i != d.size() - 1) {
      if (d[i] == '.')
        i++;
      d = d.substr(0, i + 1);
    }
    return d;
  }